

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O0

client * client_create(xcb_window_t window,xcb_rectangle_t rect,xcb_size_hints_t *hints)

{
  client *client;
  xcb_size_hints_t *hints_local;
  xcb_window_t window_local;
  xcb_rectangle_t rect_local;
  
  rect_local = (xcb_rectangle_t)malloc(0x20);
  if (rect_local == (xcb_rectangle_t)0x0) {
    rect_local.x = 0;
    rect_local.y = 0;
    rect_local.width = 0;
    rect_local.height = 0;
  }
  else {
    *(xcb_window_t *)rect_local = window;
    *(xcb_rectangle_t *)((long)rect_local + 4) = rect;
    *(xcb_size_hints_t **)((long)rect_local + 0x10) = hints;
    if ((**(uint **)((long)rect_local + 0x10) & 0x20) == 0) {
      *(undefined4 *)(*(long *)((long)rect_local + 0x10) + 0x1c) = 0xffff;
      *(undefined4 *)(*(long *)((long)rect_local + 0x10) + 0x20) = 0xffff;
    }
    if ((**(uint **)((long)rect_local + 0x10) & 0x10) == 0) {
      *(undefined4 *)(*(long *)((long)rect_local + 0x10) + 0x14) = 0;
      *(undefined4 *)(*(long *)((long)rect_local + 0x10) + 0x18) = 0;
    }
    *(undefined1 *)((long)rect_local + 0x18) = 0;
    *(undefined1 *)((long)rect_local + 0x19) = 0;
    *(xcb_window_t *)((long)rect_local + 0x1c) = 0x30;
  }
  return (client *)rect_local;
}

Assistant:

struct client *client_create(xcb_window_t window, xcb_rectangle_t rect, xcb_size_hints_t *hints)
{
        struct client *client = malloc(sizeof(struct client));

        if (client == NULL) {
                return NULL;
        }

        client->window = window;
        client->rect = rect;
        client->size_hints = hints;

        // Initialize size_hints
        if (!(client->size_hints->flags & XCB_ICCCM_SIZE_HINT_P_MAX_SIZE)) {
                client->size_hints->max_width = UINT16_MAX;
                client->size_hints->max_height = UINT16_MAX;
        }

        if (!(client->size_hints->flags & XCB_ICCCM_SIZE_HINT_P_MIN_SIZE)) {
                client->size_hints->min_width = 0;
                client->size_hints->min_height = 0;
        }

        client->is_focused = false;
        client->is_fullscreen = false;
        client->state = CLIENT_NORMAL | CLIENT_UNTHEMED;

        return client;
}